

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

TSymbol * __thiscall glslang::TSymbolTable::find(TSymbolTable *this,TString *name,int *thisDepth)

{
  long lVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  TSymbolTableLevel *this_00;
  const_iterator cVar4;
  TSymbol *pTVar5;
  long lVar6;
  
  ppTVar2 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar3 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *thisDepth = 0;
  lVar6 = (long)(int)((ulong)((long)ppTVar2 - (long)ppTVar3) >> 3);
  do {
    this_00 = (this->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar6 + -1];
    if (this_00->thisLevel == true) {
      *thisDepth = *thisDepth + 1;
    }
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                    *)this_00,name);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
           *)&this_00->level)->super__Rb_tree_header) {
      pTVar5 = (TSymbol *)0x0;
    }
    else {
      pTVar5 = (TSymbol *)cVar4._M_node[2]._M_parent;
    }
    lVar1 = lVar6 + -1;
  } while ((1 < lVar6) && (lVar6 = lVar1, pTVar5 == (TSymbol *)0x0));
  if ((this->table).
      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1]->thisLevel == false) {
    *thisDepth = 0;
  }
  return pTVar5;
}

Assistant:

TSymbol* find(const TString& name, int& thisDepth)
    {
        int level = currentLevel();
        TSymbol* symbol;
        thisDepth = 0;
        do {
            if (table[level]->isThisLevel())
                ++thisDepth;
            symbol = table[level]->find(name);
            --level;
        } while (symbol == nullptr && level >= 0);

        if (! table[level + 1]->isThisLevel())
            thisDepth = 0;

        return symbol;
    }